

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_escape_sequence<std::vector<char,std::allocator<char>>>
          (result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  const_iterator rollback;
  value_type *pvVar3;
  uint uVar4;
  location<std::vector<char,_std::allocator<char>_>_> *in_RCX;
  location<std::vector<char,_std::allocator<char>_>_> *loc_00;
  _Alloc_hider _Var5;
  char *pcVar6;
  char *pcVar7;
  size_type sVar8;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  string msg;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  token;
  allocator_type local_141;
  undefined1 local_140 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_128;
  string local_118;
  string local_f8;
  undefined1 local_d8 [32];
  undefined1 local_b8 [8];
  undefined1 local_b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_a0 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  location<std::vector<char,_std::allocator<char>_>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  rollback._M_current = *(char **)(this + 0x40);
  local_b8 = (undefined1  [8])this;
  if ((rollback._M_current == *(char **)(*(long *)(this + 8) + 8)) || (*rollback._M_current != '\\')
     ) {
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"[error]: toml::parse_escape_sequence: ","");
    local_b0._0_8_ = aaStack_a0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b0,"the next token is not a backslash \"\\\"","");
    __l._M_len = 1;
    __l._M_array = (iterator)local_b8;
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_d8,__l,(allocator_type *)&local_48);
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline(&local_118,&local_f8,
                     (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_d8,&local_68);
    local_140._16_8_ = local_118.field_2._M_allocated_capacity;
    sVar8 = local_118._M_string_length;
    local_140._0_8_ = local_140 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == &local_118.field_2) {
      aStack_128._0_8_ = local_118.field_2._8_8_;
      local_118._M_dataplus._M_p = (pointer)local_140._0_8_;
    }
    local_118._M_string_length = 0;
    local_118.field_2._M_allocated_capacity =
         local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if (local_118._M_dataplus._M_p == (pointer)local_140._0_8_) {
      paVar1->_M_allocated_capacity = local_140._16_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
           aStack_128._0_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = local_118._M_dataplus._M_p;
      (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity = local_140._16_8_;
    }
    (__return_storage_ptr__->field_1).succ.value._M_string_length = sVar8;
    local_140._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_140._16_8_ = local_140._16_8_ & 0xffffffffffffff00;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    std::
    vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._0_8_ != aaStack_a0) {
      operator_delete((void *)local_b0._0_8_,aaStack_a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
      return __return_storage_ptr__;
    }
    sVar8 = CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,local_f8.field_2._M_local_buf[0]);
    _Var5._M_p = local_f8._M_dataplus._M_p;
LAB_0012152f:
    operator_delete(_Var5._M_p,sVar8 + 1);
  }
  else {
    *(char **)(this + 0x40) = rollback._M_current + 1;
    bVar2 = rollback._M_current[1];
    if (bVar2 < 0x62) {
      if (bVar2 == 0x22) {
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar7 = "\"";
        pcVar6 = "";
      }
      else {
        if (bVar2 == 0x55) {
          sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>
          ::invoke<std::vector<char,std::allocator<char>>>
                    ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                      *)local_b8,
                     (sequence<toml::detail::character<(char)85>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<8ul>>>
                      *)this,loc);
          if (local_b8[0] != (string)0x1) {
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,
                       "[error] parse_escape_sequence: invalid token found in UTF-8 codepoint Uxxxxxxxx"
                       ,"");
            local_50 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
            std::
            pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                      ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_140,&local_50,(char (*) [5])0x14877b);
            __l_02._M_len = 1;
            __l_02._M_array = (iterator)local_140;
            std::
            vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_68,__l_02,&local_141);
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline(&local_f8,(string *)local_d8,
                             (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_68,&local_48);
LAB_00121a5d:
            sVar8 = local_f8._M_string_length;
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
              local_118.field_2._8_8_ = local_f8.field_2._8_8_;
              local_f8._M_dataplus._M_p = local_118._M_dataplus._M_p;
            }
            local_118.field_2._M_allocated_capacity._1_7_ =
                 local_f8.field_2._M_allocated_capacity._1_7_;
            local_118.field_2._M_local_buf[0] = local_f8.field_2._M_local_buf[0];
            local_f8._M_string_length = 0;
            local_f8.field_2._M_local_buf[0] = '\0';
            __return_storage_ptr__->is_ok_ = false;
            paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&__return_storage_ptr__->field_1 = paVar1;
            if (local_f8._M_dataplus._M_p == local_118._M_dataplus._M_p) {
              paVar1->_M_allocated_capacity = local_118.field_2._M_allocated_capacity;
              *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
                   local_118.field_2._8_8_;
            }
            else {
              (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p =
                   local_f8._M_dataplus._M_p;
              (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity =
                   local_118.field_2._M_allocated_capacity;
            }
            (__return_storage_ptr__->field_1).succ.value._M_string_length = sVar8;
            local_118._M_string_length = 0;
            local_118.field_2._M_allocated_capacity =
                 (ulong)(uint7)local_f8.field_2._M_allocated_capacity._1_7_ << 8;
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            std::
            vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_68);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_140._8_8_ != &aStack_128) {
              operator_delete((void *)local_140._8_8_,aStack_128._0_8_ + 1);
            }
            if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
              operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
            }
            goto LAB_00121b2f;
          }
          pvVar3 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                   ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                             *)local_b8);
          read_utf8_codepoint<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
                    (&local_118,(detail *)pvVar3,
                     (region<std::vector<char,_std::allocator<char>_>_> *)this,in_RCX);
LAB_00121865:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p == &local_118.field_2) {
            aStack_128._0_8_ = local_118.field_2._8_8_;
            _Var5._M_p = (pointer)(local_140 + 0x10);
          }
          else {
            local_140._0_8_ = local_118._M_dataplus._M_p;
            _Var5._M_p = local_118._M_dataplus._M_p;
          }
          __return_storage_ptr__->is_ok_ = true;
          paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&__return_storage_ptr__->field_1 = paVar1;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var5._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_140 + 0x10)) {
            paVar1->_M_allocated_capacity = local_118.field_2._M_allocated_capacity;
            *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
                 aStack_128._0_8_;
          }
          else {
            (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = _Var5._M_p;
            (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity =
                 local_118.field_2._M_allocated_capacity;
          }
          (__return_storage_ptr__->field_1).succ.value._M_string_length = local_118._M_string_length
          ;
LAB_00121b2f:
          if (local_b8[0] != (string)0x1) {
            return __return_storage_ptr__;
          }
          region<std::vector<char,_std::allocator<char>_>_>::~region
                    ((region<std::vector<char,_std::allocator<char>_>_> *)local_b0);
          return __return_storage_ptr__;
        }
        if (bVar2 != 0x5c) goto switchD_00121556_caseD_6f;
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar7 = "\\";
        pcVar6 = "";
      }
    }
    else {
      uVar4 = bVar2 - 0x6e;
      if (uVar4 < 8) {
        loc_00 = (location<std::vector<char,_std::allocator<char>_>_> *)
                 ((long)&switchD_00121556::switchdataD_001460d8 +
                 (long)(int)(&switchD_00121556::switchdataD_001460d8)[uVar4]);
        switch((uint)bVar2) {
        case 0x6e:
          *(char **)(this + 0x40) = rollback._M_current + 2;
          pcVar7 = "\n";
          pcVar6 = "";
          break;
        default:
switchD_00121556_caseD_6f:
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,
                     "[error] parse_escape_sequence: unknown escape sequence appeared.","");
          local_b0._0_8_ = aaStack_a0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b0,
                     "escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx","");
          __l_00._M_len = 1;
          __l_00._M_array = (iterator)local_b8;
          std::
          vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_d8,__l_00,(allocator_type *)&local_48);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f8,
                     "if you want to write backslash as just one backslash, use literal string like: regex    = \'<\\i\\c*\\s*>\'"
                     ,"");
          __l_01._M_len = 1;
          __l_01._M_array = &local_f8;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_68,__l_01,(allocator_type *)&local_50);
          format_underline((string *)local_140,&local_118,
                           (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_d8,&local_68);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,
                            CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                     local_f8.field_2._M_local_buf[0]) + 1);
          }
          std::
          vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._0_8_ != aaStack_a0) {
            operator_delete((void *)local_b0._0_8_,aaStack_a0[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          location<std::vector<char,_std::allocator<char>_>_>::reset
                    ((location<std::vector<char,_std::allocator<char>_>_> *)this,rollback);
          local_b8 = (undefined1  [8])(local_b0 + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_b8,local_140._0_8_,(char *)(local_140._8_8_ + local_140._0_8_))
          ;
          __return_storage_ptr__->is_ok_ = false;
          paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&__return_storage_ptr__->field_1 = paVar1;
          if (local_b8 == (undefined1  [8])(local_b0 + 8)) {
            paVar1->_M_allocated_capacity = local_b0._8_8_;
            *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
                 aaStack_a0[0]._M_allocated_capacity;
          }
          else {
            (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = (pointer)local_b8;
            (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity =
                 local_b0._8_8_;
          }
          (__return_storage_ptr__->field_1).succ.value._M_string_length = local_b0._0_8_;
          sVar8 = local_140._16_8_;
          _Var5._M_p = (pointer)local_140._0_8_;
          if ((undefined1 *)local_140._0_8_ == local_140 + 0x10) {
            return __return_storage_ptr__;
          }
          goto LAB_0012152f;
        case 0x72:
          *(char **)(this + 0x40) = rollback._M_current + 2;
          pcVar7 = "\r";
          pcVar6 = "";
          break;
        case 0x74:
          *(char **)(this + 0x40) = rollback._M_current + 2;
          pcVar7 = "\t";
          pcVar6 = "";
          break;
        case 0x75:
          sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>
          ::invoke<std::vector<char,std::allocator<char>>>
                    ((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                      *)local_b8,
                     (sequence<toml::detail::character<(char)117>,toml::detail::repeat<toml::detail::either<toml::detail::in_range<(char)48,(char)57>,toml::detail::in_range<(char)65,(char)70>,toml::detail::in_range<(char)97,(char)102>>,toml::detail::exactly<4ul>>>
                      *)this,loc);
          if (local_b8[0] != (string)0x1) {
            local_d8._0_8_ = local_d8 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,
                       "[error] parse_escape_sequence: invalid token found in UTF-8 codepoint uXXXX."
                       ,"");
            local_50 = (location<std::vector<char,_std::allocator<char>_>_> *)this;
            std::
            pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<toml::detail::location<std::vector<char,_std::allocator<char>_>_>_*,_const_char_(&)[5],_true>
                      ((pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_140,&local_50,(char (*) [5])0x14877b);
            __l_03._M_len = 1;
            __l_03._M_array = (iterator)local_140;
            std::
            vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::vector((vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_68,__l_03,&local_141);
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            format_underline(&local_f8,(string *)local_d8,
                             (vector<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_toml::detail::region_base_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_68,&local_48);
            goto LAB_00121a5d;
          }
          pvVar3 = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                   ::unwrap((result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                             *)local_b8);
          read_utf8_codepoint<std::vector<char,std::allocator<char>>,std::vector<char,std::allocator<char>>>
                    (&local_118,(detail *)pvVar3,
                     (region<std::vector<char,_std::allocator<char>_>_> *)this,loc_00);
          goto LAB_00121865;
        }
      }
      else if (bVar2 == 0x62) {
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar7 = "\b";
        pcVar6 = "";
      }
      else {
        if (bVar2 != 0x66) goto switchD_00121556_caseD_6f;
        *(char **)(this + 0x40) = rollback._M_current + 2;
        pcVar7 = "\f";
        pcVar6 = "";
      }
    }
    local_140._0_8_ = local_140 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_140,pcVar7,pcVar6);
    if ((undefined1 *)local_140._0_8_ == local_140 + 0x10) {
      aaStack_a0[0]._M_allocated_capacity = aStack_128._0_8_;
      local_140._0_8_ = local_b0 + 8;
    }
    __return_storage_ptr__->is_ok_ = true;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if ((undefined1 *)local_140._0_8_ == local_b0 + 8) {
      paVar1->_M_allocated_capacity = local_140._16_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.field_2 + 8) =
           aaStack_a0[0]._M_allocated_capacity;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value._M_dataplus._M_p = (pointer)local_140._0_8_;
      (__return_storage_ptr__->field_1).succ.value.field_2._M_allocated_capacity = local_140._16_8_;
    }
    (__return_storage_ptr__->field_1).succ.value._M_string_length = local_140._8_8_;
  }
  return __return_storage_ptr__;
}

Assistant:

result<std::string, std::string> parse_escape_sequence(location<Container>& loc)
{
    const auto first = loc.iter();
    if(first == loc.end() || *first != '\\')
    {
        return err(format_underline("[error]: toml::parse_escape_sequence: ", {{
            std::addressof(loc), "the next token is not a backslash \"\\\""}}));
    }
    loc.advance();
    switch(*loc.iter())
    {
        case '\\':{loc.advance(); return ok(std::string("\\"));}
        case '"' :{loc.advance(); return ok(std::string("\""));}
        case 'b' :{loc.advance(); return ok(std::string("\b"));}
        case 't' :{loc.advance(); return ok(std::string("\t"));}
        case 'n' :{loc.advance(); return ok(std::string("\n"));}
        case 'f' :{loc.advance(); return ok(std::string("\f"));}
        case 'r' :{loc.advance(); return ok(std::string("\r"));}
        case 'u' :
        {
            if(const auto token = lex_escape_unicode_short::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("[error] parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint uXXXX.",
                           {{std::addressof(loc), "here"}}));
            }
        }
        case 'U':
        {
            if(const auto token = lex_escape_unicode_long::invoke(loc))
            {
                return ok(read_utf8_codepoint(token.unwrap(), loc));
            }
            else
            {
                return err(format_underline("[error] parse_escape_sequence: "
                           "invalid token found in UTF-8 codepoint Uxxxxxxxx",
                           {{std::addressof(loc), "here"}}));
            }
        }
    }

    const auto msg = format_underline("[error] parse_escape_sequence: "
           "unknown escape sequence appeared.", {{std::addressof(loc),
           "escape sequence is one of \\, \", b, t, n, f, r, uxxxx, Uxxxxxxxx"}},
           /* Hints = */{"if you want to write backslash as just one backslash, "
           "use literal string like: regex    = '<\\i\\c*\\s*>'"});
    loc.reset(first);
    return err(msg);
}